

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O2

string * __thiscall
RigidBodyDynamics::Utils::print_hierarchy_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,Model *model,uint body_index,int indent)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  RBDLError *this_00;
  ulong uVar4;
  SpatialVector *extraout_RDX;
  SpatialVector *extraout_RDX_00;
  SpatialVector *joint_dof;
  SpatialVector *extraout_RDX_01;
  SpatialVector *extraout_RDX_02;
  int j;
  int iVar5;
  Model *model_00;
  long lVar6;
  uint uVar7;
  string local_370;
  string local_350;
  ostringstream errormsg;
  stringstream result;
  ostream local_1a8 [376];
  
  uVar4 = (ulong)body_index;
  model_00 = (Model *)((ulong)model & 0xffffffff);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&errormsg,"",(allocator<char> *)&local_370);
  std::__cxx11::stringstream::stringstream((stringstream *)&result,(string *)&errormsg,_S_out|_S_in)
  ;
  std::__cxx11::string::~string((string *)&errormsg);
  uVar7 = 0;
  if (0 < (int)body_index) {
    uVar7 = body_index;
  }
  while (uVar7 != 0) {
    std::operator<<(local_1a8,"  ");
    uVar7 = uVar7 - 1;
  }
  get_body_name_abi_cxx11_((string *)&errormsg,this,model_00,(uint)uVar4);
  std::operator<<(local_1a8,(string *)&errormsg);
  std::__cxx11::string::~string((string *)&errormsg);
  joint_dof = extraout_RDX;
  if ((int)model != 0) {
    std::operator<<(local_1a8," [ ");
    joint_dof = extraout_RDX_00;
  }
  do {
    if (*(char *)(*(long *)(this + 800) + 0x68 + (long)model_00 * 0x70) != '\x01') {
LAB_001fb6dc:
      if (model_00 != (Model *)0x0) {
        get_dof_name_abi_cxx11_
                  ((string *)&errormsg,(Utils *)((long)model_00 * 0x30 + *(long *)(this + 0xb8)),
                   joint_dof);
        poVar3 = std::operator<<(local_1a8,(string *)&errormsg);
        std::operator<<(poVar3," ]");
        std::__cxx11::string::~string((string *)&errormsg);
      }
      std::endl<char,std::char_traits<char>>(local_1a8);
      uVar7 = 0;
      while( true ) {
        lVar1 = *(long *)(*(long *)(this + 0x30) + (long)model_00 * 0x18);
        if ((ulong)(*(long *)(*(long *)(this + 0x30) + 8 + (long)model_00 * 0x18) - lVar1 >> 2) <=
            (ulong)uVar7) break;
        print_hierarchy_abi_cxx11_
                  ((string *)&errormsg,this,(Model *)(ulong)*(uint *)(lVar1 + (ulong)uVar7 * 4),
                   body_index + 1,indent);
        std::operator<<(local_1a8,(string *)&errormsg);
        std::__cxx11::string::~string((string *)&errormsg);
        uVar7 = uVar7 + 1;
      }
      uVar7 = 0;
      while( true ) {
        if ((ulong)((*(long *)(this + 0x308) - *(long *)(this + 0x300)) / 0x130) <= (ulong)uVar7)
        break;
        if (*(uint *)(*(long *)(this + 0x300) + 0x68 + (ulong)uVar7 * 0x130) == (uint)model_00) {
          for (iVar5 = 0; iVar5 <= (int)body_index; iVar5 = iVar5 + 1) {
            std::operator<<(local_1a8,"  ");
          }
          Model::GetBodyName_abi_cxx11_
                    ((string *)&errormsg,(Model *)this,*(int *)(this + 0x318) + uVar7);
          poVar3 = std::operator<<(local_1a8,(string *)&errormsg);
          poVar3 = std::operator<<(poVar3," [fixed]");
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::string::~string((string *)&errormsg);
        }
        uVar7 = uVar7 + 1;
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)&result);
      return __return_storage_ptr__;
    }
    lVar6 = (long)model_00 * 0x18;
    lVar1 = *(long *)(*(long *)(this + 0x30) + 8 + lVar6);
    lVar2 = *(long *)(*(long *)(this + 0x30) + lVar6);
    if (lVar1 == lVar2) {
      std::operator<<(local_1a8," end");
      joint_dof = extraout_RDX_02;
      goto LAB_001fb6dc;
    }
    if (4 < (ulong)(lVar1 - lVar2)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&errormsg);
      poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&errormsg);
      poVar3 = std::operator<<(poVar3,
                               "Error: Cannot determine multi-dof joint as massless body with id ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," (name: ");
      Model::GetBodyName_abi_cxx11_(&local_370,(Model *)this,(uint)model_00);
      poVar3 = std::operator<<(poVar3,(string *)&local_370);
      poVar3 = std::operator<<(poVar3,") has more than one child:");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__cxx11::string::~string((string *)&local_370);
      for (uVar7 = 0;
          (ulong)uVar7 <
          (ulong)(*(long *)(*(long *)(this + 0x30) + 8 + lVar6) -
                  *(long *)(*(long *)(this + 0x30) + lVar6) >> 2); uVar7 = uVar7 + 1) {
        poVar3 = std::operator<<((ostream *)&errormsg,"  id: ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3," name: ");
        Model::GetBodyName_abi_cxx11_
                  (&local_370,(Model *)this,
                   *(uint *)(*(long *)(*(long *)(this + 0x30) + lVar6) + (ulong)uVar7 * 4));
        poVar3 = std::operator<<(poVar3,(string *)&local_370);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::__cxx11::string::~string((string *)&local_370);
      }
      this_00 = (RBDLError *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      Errors::RBDLError::RBDLError(this_00,&local_350);
      __cxa_throw(this_00,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
    }
    get_dof_name_abi_cxx11_
              ((string *)&errormsg,(Utils *)((long)model_00 * 0x30 + *(long *)(this + 0xb8)),
               joint_dof);
    poVar3 = std::operator<<(local_1a8,(string *)&errormsg);
    std::operator<<(poVar3,", ");
    std::__cxx11::string::~string((string *)&errormsg);
    model_00 = (Model *)(ulong)**(uint **)(*(long *)(this + 0x30) + lVar6);
    joint_dof = extraout_RDX_01;
  } while( true );
}

Assistant:

std::string print_hierarchy (const RigidBodyDynamics::Model &model,
                             unsigned int body_index = 0, int indent = 0)
{
  stringstream result ("");

  for (int j = 0; j < indent; j++) {
    result << "  ";
  }

  result << get_body_name (model, body_index);

  if (body_index > 0) {
    result << " [ ";
  }

  while (model.mBodies[body_index].mIsVirtual) {
    if (model.mu[body_index].size() == 0) {
      result << " end";
      break;
    } else if (model.mu[body_index].size() > 1) {
      std::ostringstream errormsg;
      errormsg << endl <<
               "Error: Cannot determine multi-dof joint as massless body with id " <<
               body_index << " (name: " << model.GetBodyName(body_index) <<
               ") has more than one child:" << endl;
      for (unsigned int ci = 0; ci < model.mu[body_index].size(); ci++) {
        errormsg << "  id: " << model.mu[body_index][ci] << " name: " <<
                 model.GetBodyName(model.mu[body_index][ci]) << endl;
      }
      throw Errors::RBDLError(errormsg.str());
    }

    result << get_dof_name(model.S[body_index]) << ", ";

    body_index = model.mu[body_index][0];
  }

  if (body_index > 0) {
    result << get_dof_name(model.S[body_index]) << " ]";
  }
  result << endl;

  unsigned int child_index = 0;
  for (child_index = 0; child_index < model.mu[body_index].size();
       child_index++) {
    result << print_hierarchy (model, model.mu[body_index][child_index],
                               indent + 1);
  }

  // print fixed children
  for (unsigned int fbody_index = 0; fbody_index < model.mFixedBodies.size();
       fbody_index++) {
    if (model.mFixedBodies[fbody_index].mMovableParent == body_index) {
      for (int j = 0; j < indent + 1; j++) {
        result << "  ";
      }

      result << model.GetBodyName(model.fixed_body_discriminator + fbody_index) <<
             " [fixed]" << endl;
    }
  }


  return result.str();
}